

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O0

void __thiscall ExtendedMatrix::ExtendedMatrix(ExtendedMatrix *this,Matrix *main,Matrix *extension)

{
  int iVar1;
  int iVar2;
  Matrix *extension_local;
  Matrix *main_local;
  ExtendedMatrix *this_local;
  
  Matrix::Matrix(&this->main_,main);
  Matrix::Matrix(&this->extension_,extension);
  iVar1 = Matrix::GetNumRows(main);
  Permutation::Permutation(&this->row_permutation_,iVar1);
  iVar1 = Matrix::GetNumColumns(main);
  Permutation::Permutation(&this->main_column_permutation_,iVar1);
  iVar1 = Matrix::GetNumColumns(extension);
  Permutation::Permutation(&this->extension_column_permutation_,iVar1);
  iVar1 = Matrix::GetNumRows(&this->main_);
  iVar2 = Matrix::GetNumRows(&this->extension_);
  if (iVar1 == iVar2) {
    return;
  }
  __assert_fail("main_.GetNumRows() == extension_.GetNumRows()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/extended_matrix.cpp"
                ,9,"ExtendedMatrix::ExtendedMatrix(Matrix, Matrix)");
}

Assistant:

ExtendedMatrix::ExtendedMatrix(Matrix main, Matrix extension)
  : main_(std::move(main)),
    extension_(std::move(extension)),
    row_permutation_(main.GetNumRows()),
    main_column_permutation_(main.GetNumColumns()),
    extension_column_permutation_(extension.GetNumColumns()){
  assert(main_.GetNumRows() == extension_.GetNumRows());
}